

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,1,0,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  unsigned_long uVar5;
  comm *comm_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  _Map_pointer pppVar7;
  _Map_pointer pppVar8;
  comm *comm_01;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  _Elt_pointer ppVar11;
  _Elt_pointer ppVar12;
  ulong uVar13;
  pair<unsigned_long,_unsigned_long> *ppVar14;
  _Elt_pointer ppVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  pointer puVar23;
  long lVar24;
  ulong uVar25;
  unsigned_long uVar26;
  long lVar27;
  ulong *puVar28;
  bool bVar29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  size_t local_size;
  unsigned_long local_min;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_198;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_190;
  _Elt_pointer local_188;
  _Elt_pointer ppStack_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  _Elt_pointer local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_150;
  size_type local_148;
  pair<unsigned_long,_unsigned_long> local_140;
  ulong local_130;
  _Elt_pointer local_128;
  _Elt_pointer ppStack_120;
  unsigned_long local_110;
  comm *local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  _Elt_pointer local_88;
  _Elt_pointer local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_190 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_150 = right_nsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_148 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_108 = comm;
  local_188 = (_Elt_pointer)mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_148,comm);
  lVar24 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar24 != 0) {
    lVar24 = lVar24 >> 3;
    lVar27 = (long)local_188 - 1;
    do {
      ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar25 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar24 + -1];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
            if (*(ulong *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f0) <= uVar25) break;
            operator_delete(ppVar15);
            ppVar15 = (_Elt_pointer)
                      ((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar25)
            break;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar9);
        ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar9) {
          do {
            uVar26 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[lVar24 + -1];
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
              if (uVar26 != *(unsigned_long *)
                             (((_Elt_pointer)
                              ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                              -0x10))->second + 0x1f0)) break;
              operator_delete(ppVar15);
              ppVar15 = (_Elt_pointer)
                        ((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
              ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              if (uVar26 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar9);
        }
      }
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar27 + lVar24);
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar24 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_178);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  local_58.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_178,&local_58,&local_78,(allocator_type *)&local_a0);
  pvVar3 = *(void **)local_190;
  *(pointer *)local_190 =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_190 + 8) =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_190 + 0x10) =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3),
     local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_80 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_128 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar25 = ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)((_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                  (_Elt_pointer)0x0)) * 0x20;
  local_110 = nonsv;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar15 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_188;
  if (uVar25 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 1]"
                 );
  }
  for (; local_188 = ppVar9, ppVar15 < pppVar8; ppVar15 = (_Elt_pointer)&ppVar15->second) {
    operator_delete((void *)ppVar15->second);
    ppVar9 = local_188;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar7;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_128;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_80;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar20 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar13];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
            if (*(ulong *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f0) <= uVar20) break;
            operator_delete(ppVar15);
            ppVar15 = (_Elt_pointer)
                      ((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar20)
            break;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10);
        ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10) {
          do {
            uVar26 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[uVar13];
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
              if (uVar26 != *(unsigned_long *)
                             (((_Elt_pointer)
                              ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                              -0x10))->second + 0x1f0)) break;
              operator_delete(ppVar15);
              ppVar15 = (_Elt_pointer)
                        ((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
              ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              if (uVar26 != local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10);
        }
      }
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar13 + (long)ppVar9);
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar13];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_178);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar13 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar29 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_160 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_88 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_190,*(undefined8 *)(local_190 + 8));
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar24 = (long)ppVar15 - (long)local_188;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_130 = (local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar24 = (lVar24 >> 4) + ((long)ppVar9 - (long)local_198 >> 4) +
           (((uVar13 >> 3) - 1) + (ulong)bVar29) * 0x20;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_120 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar15 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_108;
  if (lVar24 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 1]"
                 );
  }
  for (; local_198 = ppVar10, local_128 = ppVar9, local_108 = comm_00, ppVar15 < pppVar7;
      ppVar15 = (_Elt_pointer)&ppVar15->second) {
    operator_delete((void *)ppVar15->second);
    ppVar9 = local_128;
    ppVar10 = local_198;
    comm_00 = local_108;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_188;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_128;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_120;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_198;
  if (lVar24 + uVar25 != *(long *)(local_190 + 8) - *(long *)local_190 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_178,&local_130,1,comm_00);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a0,(long)comm_00->m_size,(value_type_conflict *)&local_b8,
             (allocator_type *)&local_100);
  local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,(long)comm_00->m_size,(value_type_conflict *)&local_100,
             (allocator_type *)&local_d0);
  comm_01 = local_108;
  pvVar6 = local_150;
  iVar1 = comm_00->m_rank;
  lVar24 = (long)iVar1;
  if (0 < lVar24) {
    uVar13 = *(ulong *)((long)local_178.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
    local_198 = (_Elt_pointer)
                local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_188 = (_Elt_pointer)
                local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar27 = lVar24;
    lVar17 = 0;
    do {
      lVar16 = lVar27 + -1;
      uVar20 = lVar17 + 1U;
      if (lVar17 + 1U < uVar25) {
        uVar20 = uVar25;
      }
      uVar4 = *(ulong *)((long)local_178.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar27 * 8 + -8);
      lVar18 = lVar17 + -1;
      puVar28 = (ulong *)(lVar17 * 0x10 + *(long *)local_190);
      do {
        lVar19 = uVar20 - 1;
        if (lVar18 + (1 - uVar20) == -1) break;
        lVar19 = lVar18 + 1;
        uVar22 = *puVar28;
        lVar18 = lVar19;
        puVar28 = puVar28 + 2;
      } while (uVar4 <= uVar22);
      if (uVar4 <= uVar13) {
        *(long *)((long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar16 * 8) =
             (lVar19 - lVar17) + 1;
        *(long *)((long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar16 * 8) = lVar17;
        uVar13 = uVar4;
        if (*(ulong *)((long)local_178.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar16 * 8) < local_130)
        break;
      }
      bVar29 = 1 < lVar27;
      lVar27 = lVar16;
      lVar17 = lVar19;
    } while (bVar29);
  }
  iVar2 = local_108->m_size;
  if (iVar1 < iVar2 + -1) {
    lVar27 = *(long *)local_190;
    uVar13 = ((unsigned_long *)
             ((long)local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar24];
    lVar24 = lVar24 + 1;
    uVar20 = (*(long *)(local_190 + 8) - lVar27 >> 4) - 1;
    do {
      uVar4 = local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24];
      uVar22 = uVar20;
      if (uVar25 < uVar20) {
        puVar28 = (ulong *)(uVar20 * 0x10 + lVar27);
        uVar21 = uVar20;
        do {
          uVar22 = uVar21;
          if (*puVar28 < uVar4) break;
          uVar21 = uVar21 - 1;
          puVar28 = puVar28 + -2;
          uVar22 = uVar25;
        } while (uVar25 < uVar21);
      }
      if (uVar4 <= uVar13) {
        local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = (uVar20 - uVar22) + 1;
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar24] = uVar22;
        uVar13 = uVar4;
        if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar24] < local_130) break;
      }
      lVar24 = lVar24 + 1;
      uVar20 = uVar22;
    } while (iVar2 != (int)lVar24);
  }
  mxx::all2all<unsigned_long>(&local_100,&local_a0,local_108);
  mxx::impl::get_displacements<unsigned_long>(&local_d0,&local_100);
  local_128 = (_Elt_pointer)
              (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1] +
              local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_e8,(size_type)local_128,(allocator_type *)&local_140);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_190,&local_a0,&local_b8,
             local_e8.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_100,&local_d0,comm_01);
  local_198 = (_Elt_pointer)
              local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_01->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_148);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar6,local_148);
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  for (ppVar15 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVar15 < pppVar8; ppVar15 = (_Elt_pointer)&ppVar15->second) {
    operator_delete((void *)ppVar15->second);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar9;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar7;
  lVar24 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  if (lVar24 != 0) {
    uVar25 = lVar24 >> 3;
    do {
      uVar25 = uVar25 - 1;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar23 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar13 = puVar23[uVar25];
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
            uVar26 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            if (*(ulong *)(uVar26 + 0x1f0) <= uVar13) {
              if (uVar13 == *(ulong *)(uVar26 + 0x1f0)) {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[*(long *)(uVar26 + 0x1f8)] = uVar25;
                operator_delete(ppVar15);
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              break;
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar26 + 0x1f8)] = uVar25;
            operator_delete(ppVar15);
            ppVar15 = (_Elt_pointer)
                      ((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar13) {
              if (uVar13 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar25;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
              break;
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar25;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_140.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar25];
      local_140.second = uVar25;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_140);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_140.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar25;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (uVar25 != 0);
  }
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_198 != (_Elt_pointer)0x0) {
    uVar25 = 0;
    do {
      if (ppVar15 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      ppVar14 = local_e8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + ~uVar25 + (long)local_198;
      uVar26 = ~uVar25 + (long)local_198 + local_148;
      ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
      do {
        uVar13 = ppVar14->first;
        if (ppVar15 == ppVar9) {
          uVar5 = ((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          if (*(ulong *)(uVar5 + 0x1f0) <= uVar13) {
            if (uVar13 == *(ulong *)(uVar5 + 0x1f0)) {
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[*(long *)(uVar5 + 0x1f8)] = uVar26;
              operator_delete(ppVar9);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            break;
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar5 + 0x1f8)] = uVar26;
          operator_delete(ppVar9);
          ppVar9 = (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar9 + 0x20;
          ppVar15 = ppVar9 + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar9;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          if (ppVar15[-1].first <= uVar13) {
            if (uVar13 == ppVar15[-1].first) {
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar15[-1].second] = uVar26;
              ppVar15 = ppVar15 + -1;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15;
            }
            break;
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar15[-1].second] = uVar26;
          ppVar15 = ppVar15 + -1;
        }
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15;
      } while (ppVar15 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      uVar25 = uVar25 + 1;
    } while ((_Elt_pointer)uVar25 != local_198);
  }
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar9 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar6 = local_150;
  if (ppVar15 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar23 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar11 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVar12 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar15 == ppVar11) {
        ppVar11 = (_Elt_pointer)ppVar12[-1].second;
        ppVar12 = (_Elt_pointer)&ppVar12[-1].second;
        puVar23[ppVar11[0x1f].second] = local_110;
        ppVar15 = ppVar11 + 0x20;
      }
      else {
        puVar23[ppVar15[-1].second] = local_110;
      }
      ppVar15 = ppVar15 + -1;
    } while (ppVar15 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_150 = pvVar6, ppVar9 < pppVar8; ppVar9 = (_Elt_pointer)&ppVar9->second) {
    operator_delete((void *)ppVar9->second);
    pvVar6 = local_150;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar7;
  puVar23 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar23) {
    uVar25 = 0;
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            if (*(ulong *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f0) <= puVar23[uVar25]) break;
            (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [*(long *)(((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x1f8)] = uVar25;
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar23[uVar25]) break;
            (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar25;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
        puVar23 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      local_140.first = puVar23[uVar25];
      local_140.second = uVar25;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_140);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_140.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar25;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar25 = uVar25 + 1;
      puVar23 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar25 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar23 >> 3
                             ));
  }
  ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_128 != local_198) {
    lVar27 = (long)local_128 - (long)local_198;
    lVar24 = 0;
    do {
      if (ppVar15 == ppVar9) break;
      ppVar14 = local_e8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar24 + (long)local_198;
      uVar26 = lVar24 + (long)local_198 + local_148;
      do {
        if (ppVar15 == local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (*(ulong *)(((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x1f0) <= ppVar14->first) break;
          (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [*(long *)(((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x1f8)] = uVar26;
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar9 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          if (ppVar15[-1].first <= ppVar14->first) break;
          (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar15[-1].second] = uVar26;
          ppVar15 = ppVar15 + -1;
        }
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15;
      } while (ppVar15 != ppVar9);
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar27 + (ulong)(lVar27 == 0));
  }
  if (ppVar15 != ppVar9) {
    puVar23 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppVar11 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar10 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar15 == ppVar10) {
        ppVar10 = (_Elt_pointer)ppVar11[-1].second;
        ppVar11 = (_Elt_pointer)&ppVar11[-1].second;
        puVar23[ppVar10[0x1f].second] = local_110;
        ppVar15 = ppVar10 + 0x20;
      }
      else {
        puVar23[ppVar15[-1].second] = local_110;
      }
      ppVar15 = ppVar15 + -1;
    } while (ppVar15 != ppVar9);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_190,&local_e8);
  if (local_e8.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}